

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O2

void __thiscall
icu_63::UCharsTrie::Iterator::Iterator
          (Iterator *this,UCharsTrie *trie,int32_t maxStringLength,UErrorCode *errorCode)

{
  int32_t iVar1;
  int iVar2;
  uint uVar3;
  char16_t *pcVar4;
  uint srcLength;
  UVector32 *this_00;
  ConstChar16Ptr local_40 [3];
  
  this->uchars_ = trie->uchars_;
  pcVar4 = trie->pos_;
  this->pos_ = pcVar4;
  this->initialPos_ = pcVar4;
  iVar1 = trie->remainingMatchLength_;
  this->remainingMatchLength_ = iVar1;
  this->initialRemainingMatchLength_ = iVar1;
  this->skipValue_ = '\0';
  (this->str_).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e4bf0;
  (this->str_).fUnion.fStackFields.fLengthAndFlags = 2;
  this->maxLength_ = maxStringLength;
  this->value_ = 0;
  this->stack_ = (UVector32 *)0x0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)trie);
    if (this_00 == (UVector32 *)0x0) {
      this->stack_ = (UVector32 *)0x0;
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      UVector32::UVector32(this_00,errorCode);
      this->stack_ = this_00;
      if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
         (iVar2 = this->remainingMatchLength_, -1 < iVar2)) {
        uVar3 = this->maxLength_;
        srcLength = uVar3;
        if (iVar2 < (int)uVar3) {
          srcLength = iVar2 + 1U;
        }
        if ((int)uVar3 < 1) {
          srcLength = iVar2 + 1U;
        }
        local_40[0].p_ = this->pos_;
        UnicodeString::append(&this->str_,local_40,srcLength);
        this->pos_ = this->pos_ + srcLength;
        this->remainingMatchLength_ = this->remainingMatchLength_ - srcLength;
      }
    }
  }
  return;
}

Assistant:

UCharsTrie::Iterator::Iterator(const UCharsTrie &trie, int32_t maxStringLength,
                               UErrorCode &errorCode)
        : uchars_(trie.uchars_), pos_(trie.pos_), initialPos_(trie.pos_),
          remainingMatchLength_(trie.remainingMatchLength_),
          initialRemainingMatchLength_(trie.remainingMatchLength_),
          skipValue_(FALSE),
          maxLength_(maxStringLength), value_(0), stack_(NULL) {
    if(U_FAILURE(errorCode)) {
        return;
    }
    stack_=new UVector32(errorCode);
    if(U_FAILURE(errorCode)) {
        return;
    }
    if(stack_==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    if(length>=0) {
        // Pending linear-match node, append remaining UChars to str_.
        ++length;
        if(maxLength_>0 && length>maxLength_) {
            length=maxLength_;  // This will leave remainingMatchLength>=0 as a signal.
        }
        str_.append(pos_, length);
        pos_+=length;
        remainingMatchLength_-=length;
    }
}